

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::insertBefore(DOMParentNode *this,DOMNode *newChild,DOMNode *refChild)

{
  DOMDocument *pDVar1;
  XMLSize_t XVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  DOMNodeImpl *pDVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  DOMRangeImpl *this_01;
  DOMException *this_02;
  MemoryManager **ppMVar13;
  XMLSize_t i;
  XMLSize_t getAt;
  undefined4 extraout_var_03;
  undefined4 extraout_var_07;
  
  if (newChild == (DOMNode *)0x0) {
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerDocument == (DOMDocument *)0x0) {
      ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_02,3,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
  }
  else {
    pDVar6 = getContainingNodeImpl(this);
    if ((pDVar6->flags & 1) == 0) {
      iVar5 = (*newChild->_vptr_DOMNode[0xc])(newChild);
      if ((DOMDocument *)CONCAT44(extraout_var,iVar5) == this->fOwnerDocument) {
        iVar5 = (*newChild->_vptr_DOMNode[0x12])(newChild);
        if ((char)iVar5 != '\0') {
          iVar5 = (*this->fContainingNode->_vptr_DOMNode[5])();
          pDVar8 = (DOMNode *)CONCAT44(extraout_var_00,iVar5);
          if ((DOMNode *)CONCAT44(extraout_var_00,iVar5) != (DOMNode *)0x0) {
            do {
              pDVar7 = pDVar8;
              iVar5 = (*pDVar7->_vptr_DOMNode[5])(pDVar7);
              if (pDVar7 == newChild) break;
              pDVar8 = (DOMNode *)CONCAT44(extraout_var_01,iVar5);
            } while ((DOMNode *)CONCAT44(extraout_var_01,iVar5) != (DOMNode *)0x0);
            if (pDVar7 == newChild) {
              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
              if (this->fOwnerDocument == (DOMDocument *)0x0) {
                ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
              }
              else {
                ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
              }
              DOMException::DOMException
                        (this_02,3,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
              goto LAB_0027f7a4;
            }
          }
        }
        if (refChild != (DOMNode *)0x0) {
          iVar5 = (*refChild->_vptr_DOMNode[5])(refChild);
          if ((DOMNode *)CONCAT44(extraout_var_02,iVar5) != this->fContainingNode) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            if (this->fOwnerDocument == (DOMDocument *)0x0) {
              ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
            }
            else {
              ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
            }
            DOMException::DOMException
                      (this_02,8,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
            goto LAB_0027f7a4;
          }
          iVar5 = (*newChild->_vptr_DOMNode[0x1b])(newChild,refChild);
          if ((char)iVar5 != '\0') {
            return newChild;
          }
        }
        iVar5 = (*newChild->_vptr_DOMNode[4])(newChild);
        if (iVar5 == 0xb) {
          iVar5 = (*newChild->_vptr_DOMNode[7])(newChild);
          pDVar8 = (DOMNode *)CONCAT44(extraout_var_03,iVar5);
          while (pDVar8 != (DOMNode *)0x0) {
            bVar4 = DOMDocumentImpl::isKidOK(this->fContainingNode,pDVar8);
            if (!bVar4) {
              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
              if (this->fOwnerDocument == (DOMDocument *)0x0) {
                ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
              }
              else {
                ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
              }
              DOMException::DOMException
                        (this_02,3,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
              goto LAB_0027f7a4;
            }
            iVar5 = (*pDVar8->_vptr_DOMNode[10])(pDVar8);
            pDVar8 = (DOMNode *)CONCAT44(extraout_var_04,iVar5);
          }
          while (iVar5 = (*newChild->_vptr_DOMNode[0x12])(newChild), (char)iVar5 != '\0') {
            pDVar8 = this->fContainingNode;
            iVar5 = (*newChild->_vptr_DOMNode[7])(newChild);
            (*pDVar8->_vptr_DOMNode[0xe])(pDVar8,CONCAT44(extraout_var_05,iVar5),refChild);
          }
LAB_0027f5ec:
          (*this->fOwnerDocument[-1].super_DOMNode._vptr_DOMNode[0x4e])
                    (&this->fOwnerDocument[-1].super_DOMNode);
          pDVar1 = this->fOwnerDocument;
          if (pDVar1 != (DOMDocument *)0x0) {
            iVar5 = (*pDVar1[-1].super_DOMNode._vptr_DOMNode[0x46])(&pDVar1[-1].super_DOMNode);
            this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)CONCAT44(extraout_var_07,iVar5);
            if ((this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
               (XVar2 = this_00->fCurCount, XVar2 != 0)) {
              getAt = 0;
              do {
                this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,getAt);
                DOMRangeImpl::updateRangeForInsertedNode(this_01,newChild);
                getAt = getAt + 1;
              } while (XVar2 != getAt);
            }
          }
          return newChild;
        }
        bVar4 = DOMDocumentImpl::isKidOK(this->fContainingNode,newChild);
        if (bVar4) {
          iVar5 = (*newChild->_vptr_DOMNode[5])(newChild);
          plVar9 = (long *)CONCAT44(extraout_var_06,iVar5);
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x80))(plVar9,newChild);
          }
          pDVar8 = this->fContainingNode;
          plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                          0xfffffffffffffffe);
          if ((plVar9 == (long *)0x0) ||
             (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
          }
          else {
            lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
            *(DOMNode **)(lVar10 + 8) = pDVar8;
            plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                            0xfffffffffffffffe);
            if ((plVar9 != (long *)0x0) &&
               (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 != 0)) {
              lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
              *(ushort *)(lVar10 + 0x10) = *(ushort *)(lVar10 + 0x10) | 8;
              pDVar8 = this->fFirstChild;
              if (pDVar8 == (DOMNode *)0x0) {
                this->fFirstChild = newChild;
                plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                if ((plVar9 == (long *)0x0) ||
                   (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
                lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
                *(ushort *)(lVar10 + 0x10) = *(ushort *)(lVar10 + 0x10) | 0x10;
                plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                if ((plVar9 == (long *)0x0) ||
                   (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
              }
              else {
                if (refChild != (DOMNode *)0x0) {
                  if (pDVar8 == refChild) {
                    plVar9 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,
                                                    &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar9 == (long *)0x0) ||
                       (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                      DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                    }
                    else {
                      lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
                      *(ushort *)(lVar10 + 0x10) = *(ushort *)(lVar10 + 0x10) & 0xffef;
                      pDVar8 = this->fFirstChild;
                      plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                      &HasDOMChildImpl::typeinfo,0xfffffffffffffffe)
                      ;
                      if ((plVar9 == (long *)0x0) ||
                         (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                        this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                        DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                      }
                      else {
                        lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
                        *(DOMNode **)(lVar10 + 8) = pDVar8;
                        if (this->fFirstChild == (DOMNode *)0x0) {
                          plVar9 = (long *)0x0;
                        }
                        else {
                          plVar9 = (long *)__dynamic_cast(this->fFirstChild,&DOMNode::typeinfo,
                                                          &HasDOMChildImpl::typeinfo,
                                                          0xfffffffffffffffe);
                        }
                        if ((plVar9 == (long *)0x0) ||
                           (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                          this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                          DOMException::DOMException
                                    (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                        }
                        else {
                          puVar12 = (undefined8 *)(**(code **)(*plVar9 + 0x10))(plVar9);
                          uVar3 = *puVar12;
                          plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                          &HasDOMChildImpl::typeinfo,
                                                          0xfffffffffffffffe);
                          if ((plVar9 == (long *)0x0) ||
                             (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                            DOMException::DOMException
                                      (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                          }
                          else {
                            puVar12 = (undefined8 *)(**(code **)(*plVar9 + 0x10))(plVar9);
                            *puVar12 = uVar3;
                            if (this->fFirstChild == (DOMNode *)0x0) {
                              plVar9 = (long *)0x0;
                            }
                            else {
                              plVar9 = (long *)__dynamic_cast(this->fFirstChild,&DOMNode::typeinfo,
                                                              &HasDOMChildImpl::typeinfo,
                                                              0xfffffffffffffffe);
                            }
                            if ((plVar9 == (long *)0x0) ||
                               (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                              DOMException::DOMException
                                        (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                            }
                            else {
                              puVar12 = (undefined8 *)(**(code **)(*plVar9 + 0x10))(plVar9);
                              *puVar12 = newChild;
                              this->fFirstChild = newChild;
                              plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                              &HasDOMNodeImpl::typeinfo,
                                                              0xfffffffffffffffe);
                              if ((plVar9 != (long *)0x0) &&
                                 (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 != 0)) {
                                lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
                                *(ushort *)(lVar10 + 0x10) = *(ushort *)(lVar10 + 0x10) | 0x10;
                                goto LAB_0027f5ec;
                              }
                              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                              DOMException::DOMException
                                        (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    plVar9 = (long *)__dynamic_cast(refChild,&DOMNode::typeinfo,
                                                    &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar9 == (long *)0x0) ||
                       (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                      DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                    }
                    else {
                      plVar9 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9);
                      lVar10 = *plVar9;
                      plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                      &HasDOMChildImpl::typeinfo,0xfffffffffffffffe)
                      ;
                      if ((plVar9 == (long *)0x0) ||
                         (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 == 0)) {
                        this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                        DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                      }
                      else {
                        lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9);
                        *(DOMNode **)(lVar11 + 8) = refChild;
                        if (lVar10 == 0) {
                          plVar9 = (long *)0x0;
                        }
                        else {
                          plVar9 = (long *)__dynamic_cast(lVar10,&DOMNode::typeinfo,
                                                          &HasDOMChildImpl::typeinfo,
                                                          0xfffffffffffffffe);
                        }
                        if ((plVar9 == (long *)0x0) ||
                           (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 == 0)) {
                          this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                          DOMException::DOMException
                                    (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                        }
                        else {
                          lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9);
                          *(DOMNode **)(lVar11 + 8) = newChild;
                          plVar9 = (long *)__dynamic_cast(refChild,&DOMNode::typeinfo,
                                                          &HasDOMChildImpl::typeinfo,
                                                          0xfffffffffffffffe);
                          if ((plVar9 == (long *)0x0) ||
                             (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 == 0)) {
                            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                            DOMException::DOMException
                                      (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                          }
                          else {
                            puVar12 = (undefined8 *)(**(code **)(*plVar9 + 0x10))(plVar9);
                            *puVar12 = newChild;
                            plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                            &HasDOMChildImpl::typeinfo,
                                                            0xfffffffffffffffe);
                            if ((plVar9 != (long *)0x0) &&
                               (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 != 0)) {
                              plVar9 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9);
                              *plVar9 = lVar10;
                              goto LAB_0027f5ec;
                            }
                            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                            DOMException::DOMException
                                      (this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0027f7a4;
                }
                plVar9 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo
                                                ,0xfffffffffffffffe);
                if ((plVar9 == (long *)0x0) ||
                   (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
                plVar9 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9);
                lVar10 = *plVar9;
                if (lVar10 == 0) {
                  plVar9 = (long *)0x0;
                }
                else {
                  plVar9 = (long *)__dynamic_cast(lVar10,&DOMNode::typeinfo,
                                                  &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                }
                if ((plVar9 == (long *)0x0) ||
                   (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
                lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9);
                *(DOMNode **)(lVar11 + 8) = newChild;
                plVar9 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                if ((plVar9 == (long *)0x0) ||
                   (lVar11 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar11 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
                plVar9 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9);
                *plVar9 = lVar10;
                if (this->fFirstChild == (DOMNode *)0x0) {
                  plVar9 = (long *)0x0;
                }
                else {
                  plVar9 = (long *)__dynamic_cast(this->fFirstChild,&DOMNode::typeinfo,
                                                  &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                }
                if ((plVar9 == (long *)0x0) ||
                   (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  goto LAB_0027f7a4;
                }
              }
              puVar12 = (undefined8 *)(**(code **)(*plVar9 + 0x10))(plVar9);
              *puVar12 = newChild;
              goto LAB_0027f5ec;
            }
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
          }
        }
        else {
          this_02 = (DOMException *)__cxa_allocate_exception(0x28);
          if (this->fOwnerDocument == (DOMDocument *)0x0) {
            ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
          }
          else {
            ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
          }
          DOMException::DOMException
                    (this_02,3,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
        }
      }
      else {
        this_02 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this->fOwnerDocument == (DOMDocument *)0x0) {
          ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
        }
        DOMException::DOMException
                  (this_02,4,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
      }
    }
    else {
      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        ppMVar13 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        ppMVar13 = (MemoryManager **)&this->fOwnerDocument[10].super_DOMNode;
      }
      DOMException::DOMException(this_02,7,0,(MemoryManager *)((DOMNode *)ppMVar13)->_vptr_DOMNode);
    }
  }
LAB_0027f7a4:
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMParentNode::insertBefore(DOMNode *newChild, DOMNode *refChild) {
    //not really in the specs, but better than nothing
    if(newChild==NULL)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    const DOMNodeImpl *thisNodeImpl = getContainingNodeImpl();
    if (thisNodeImpl->isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMParentNodeMemoryManager);

    if (newChild->getOwnerDocument() != fOwnerDocument)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMParentNodeMemoryManager);

    // Prevent cycles in the tree
    //only need to do this if the node has children
    if(newChild->hasChildNodes()) {
        bool treeSafe=true;
        for(DOMNode *a=getContainingNode()->getParentNode();
            treeSafe && a!=0;
            a=a->getParentNode())
            treeSafe=(newChild!=a);
        if(!treeSafe)
            throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
    }

    // refChild must in fact be a child of this node (or 0)
    if (refChild!=0 && refChild->getParentNode() != getContainingNode())
        throw DOMException(DOMException::NOT_FOUND_ERR,0, GetDOMParentNodeMemoryManager);

    // if the new node has to be placed before itself, we don't have to do anything
    // (even worse, we would crash if we continue, as we assume they are two distinct nodes)
    if (refChild!=0 && newChild->isSameNode(refChild))
        return newChild;

    if (newChild->getNodeType() == DOMNode::DOCUMENT_FRAGMENT_NODE)
    {
        // SLOW BUT SAFE: We could insert the whole subtree without
        // juggling so many next/previous pointers. (Wipe out the
        // parent's child-list, patch the parent pointers, set the
        // ends of the list.) But we know some subclasses have special-
        // case behavior they add to insertBefore(), so we don't risk it.
        // This approch also takes fewer bytecodes.

        // NOTE: If one of the children is not a legal child of this
        // node, throw HIERARCHY_REQUEST_ERR before _any_ of the children
        // have been transferred. (Alternative behaviors would be to
        // reparent up to the first failure point or reparent all those
        // which are acceptable to the target node, neither of which is
        // as robust. PR-DOM-0818 isn't entirely clear on which it
        // recommends?????

        // No need to check kids for right-document; if they weren't,
        // they wouldn't be kids of that DocFrag.
        for(DOMNode *kid=newChild->getFirstChild(); // Prescan
              kid!=0;
              kid=kid->getNextSibling())
        {
            if (!DOMDocumentImpl::isKidOK(getContainingNode(), kid))
              throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
        }
        while(newChild->hasChildNodes())     // Move
            getContainingNode()->insertBefore(newChild->getFirstChild(),refChild);
    }

    else if (!DOMDocumentImpl::isKidOK(getContainingNode(), newChild))
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    else
    {
        DOMNode *oldparent=newChild->getParentNode();
        if(oldparent!=0)
            oldparent->removeChild(newChild);

        // Attach up
        castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
        castToNodeImpl(newChild)->isOwned(true);

        // Attach before and after
        // Note: fFirstChild.previousSibling == lastChild!!
        if (fFirstChild == 0) {
            // this our first and only child
            fFirstChild = newChild;
            castToNodeImpl(newChild)->isFirstChild(true);
            // castToChildImpl(newChild)->previousSibling = newChild;
            DOMChildNode *newChild_ci = castToChildImpl(newChild);
            newChild_ci->previousSibling = newChild;
        } else {
            if (refChild == 0) {
                // this is an append
                DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
                castToChildImpl(lastChild)->nextSibling = newChild;
                castToChildImpl(newChild)->previousSibling = lastChild;
                castToChildImpl(fFirstChild)->previousSibling = newChild;
            } else {
                // this is an insert
                if (refChild == fFirstChild) {
                    // at the head of the list
                    castToNodeImpl(fFirstChild)->isFirstChild(false);
                    castToChildImpl(newChild)->nextSibling = fFirstChild;
                    castToChildImpl(newChild)->previousSibling = castToChildImpl(fFirstChild)->previousSibling;
                    castToChildImpl(fFirstChild)->previousSibling = newChild;
                    fFirstChild = newChild;
                    castToNodeImpl(newChild)->isFirstChild(true);
                } else {
                    // somewhere in the middle
                    DOMNode *prev = castToChildImpl(refChild)->previousSibling;
                    castToChildImpl(newChild)->nextSibling = refChild;
                    castToChildImpl(prev)->nextSibling = newChild;
                    castToChildImpl(refChild)->previousSibling = newChild;
                    castToChildImpl(newChild)->previousSibling = prev;
                }
            }
        }
    }

    changed();

    if (fOwnerDocument != 0) {
        Ranges* ranges = ((DOMDocumentImpl*)fOwnerDocument)->getRanges();
        if ( ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedNode(newChild);
                }
            }
        }
    }

    return newChild;
}